

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
checkInterfacePropertyCompatibility<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_6)

{
  pointer pcVar1;
  cmGeneratorTarget *tgt_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__ptr;
  undefined1 auVar2 [8];
  char *pcVar3;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  int iVar6;
  cmValue value;
  cmPropertyMap *pcVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar9;
  string *psVar10;
  ostream *poVar11;
  size_t sVar12;
  pointer ppcVar13;
  _Rb_tree_header *p_Var14;
  bool bVar15;
  bool bVar16;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  consistent;
  string reportEntry;
  string report;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ifacePropContent;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  string interfaceProperty;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_368;
  undefined1 local_360 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  undefined1 *local_338;
  long local_330;
  undefined1 local_328;
  undefined7 uStack_327;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  char *local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_298;
  _Base_ptr local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  char *local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  char *local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined1 local_240 [8];
  char *local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230 [6];
  ios_base local_1d0 [264];
  char *local_c8;
  _Base_ptr local_c0;
  pointer local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  pointer local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  __node_base *local_70 [2];
  __node_base local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  value = cmGeneratorTarget::GetProperty(tgt,p);
  valueAsString<cmValue>(__return_storage_ptr__,value);
  pcVar7 = cmTarget::GetProperties(tgt->Target);
  cmPropertyMap::GetKeys_abi_cxx11_(&local_88,pcVar7);
  _Var8 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar15 = _Var8._M_current !=
           local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_290 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_288 = local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  p_Var14 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header;
  local_c8 = defaultValue;
  if ((_Rb_tree_header *)local_290 != p_Var14 &&
      _Var8._M_current !=
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x17f5,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = std::basic_string<char>]"
                 );
  }
  pvVar9 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar9->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar9->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    psVar10 = cmTarget::GetName_abi_cxx11_(tgt->Target);
    local_230[0]._8_8_ = (psVar10->_M_dataplus)._M_p;
    local_230[0]._0_8_ = psVar10->_M_string_length;
    local_240 = (undefined1  [8])0xb;
    local_238 = " * Target \"";
    views._M_len = 2;
    views._M_array = (iterator)local_240;
    cmCatViews_abi_cxx11_((string *)&local_2f8,views);
    if (_Var8._M_current != local_288) {
      std::__cxx11::string::append(local_2f8._M_local_buf);
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      local_260 = &local_250;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_260,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
      if (local_260 == &local_250) {
        local_230[0]._8_8_ = local_250._8_8_;
        local_240 = (undefined1  [8])local_230;
      }
      else {
        local_240 = (undefined1  [8])local_260;
      }
      local_230[0]._M_allocated_capacity._1_7_ = local_250._M_allocated_capacity._1_7_;
      local_230[0]._M_local_buf[0] = local_250._M_local_buf[0];
      local_238 = local_258;
      local_258 = (char *)0x0;
      local_250._M_local_buf[0] = '\0';
      local_260 = &local_250;
      std::__cxx11::string::_M_append(local_2f8._M_local_buf,(ulong)local_240);
      if (local_240 != (undefined1  [8])local_230) {
        operator_delete((void *)local_240,local_230[0]._M_allocated_capacity + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,
                        CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0]) +
                        1);
      }
    }
    std::__cxx11::string::append(local_2f8._M_local_buf);
    std::operator+(&local_50,"INTERFACE_",p);
    local_368 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    iVar6 = std::__cxx11::string::compare((char *)p);
    if (iVar6 == 0) {
      local_360._0_8_ = tgt->LocalGenerator;
      std::
      make_unique<cmGeneratorExpressionInterpreter,cmLocalGenerator*,std::__cxx11::string_const&,cmGeneratorTarget_const*&>
                ((cmLocalGenerator **)local_240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360,
                 (cmGeneratorTarget **)config);
      auVar2 = local_240;
      __ptr = local_368;
      local_240 = (undefined1  [8])0x0;
      local_368 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)auVar2;
      if (__ptr != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0) {
        std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                  ((default_delete<cmGeneratorExpressionInterpreter> *)&local_368,
                   (cmGeneratorExpressionInterpreter *)__ptr);
      }
      if (local_240 != (undefined1  [8])0x0) {
        std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                  ((default_delete<cmGeneratorExpressionInterpreter> *)local_240,
                   (cmGeneratorExpressionInterpreter *)local_240);
      }
    }
    ppcVar13 = (pvVar9->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_b8 = (pvVar9->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    pbVar5 = __return_storage_ptr__;
    local_c0 = &p_Var14->_M_header;
    local_b0 = _Var8._M_current;
    if (ppcVar13 != local_b8) {
      do {
        local_298 = pbVar5;
        tgt_00 = *ppcVar13;
        local_a8 = ppcVar13;
        pcVar7 = cmTarget::GetProperties(tgt_00->Target);
        cmPropertyMap::GetKeys_abi_cxx11_(&local_a0,pcVar7);
        _Var8 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_a0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_a0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_50);
        pbVar4 = local_a0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        getTypedProperty<std::__cxx11::string>
                  (&local_2b8,tgt_00,&local_50,(cmGeneratorExpressionInterpreter *)local_368);
        local_338 = &local_328;
        local_330 = 0;
        local_328 = 0;
        if (_Var8._M_current != pbVar4) {
          std::__cxx11::string::append((char *)&local_338);
          psVar10 = cmTarget::GetName_abi_cxx11_(tgt_00->Target);
          std::__cxx11::string::_M_append((char *)&local_338,(ulong)(psVar10->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_338);
          local_2d8 = &local_2c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d8,local_2b8._M_dataplus._M_p,
                     local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
          local_240 = (undefined1  [8])local_230;
          if (local_2d8 == &local_2c8) {
            local_230[0]._8_8_ = local_2c8._8_8_;
          }
          else {
            local_240 = (undefined1  [8])local_2d8;
          }
          local_230[0]._M_allocated_capacity._1_7_ = local_2c8._M_allocated_capacity._1_7_;
          local_230[0]._M_local_buf[0] = local_2c8._M_local_buf[0];
          local_238 = local_2d0;
          local_2d0 = (char *)0x0;
          local_2c8._M_local_buf[0] = '\0';
          local_2d8 = &local_2c8;
          std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_240);
          if (local_240 != (undefined1  [8])local_230) {
            operator_delete((void *)local_240,local_230[0]._M_allocated_capacity + 1);
          }
          if (local_2d8 != &local_2c8) {
            operator_delete(local_2d8,
                            CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]
                                    ) + 1);
          }
          std::__cxx11::string::append((char *)&local_338);
        }
        if (local_b0 == local_288) {
          if (local_290 == local_c0) {
            if (_Var8._M_current == pbVar4) goto LAB_00373a4a;
            if (bVar15) {
              consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_360,__return_storage_ptr__,&local_2b8,t);
              std::__cxx11::string::_M_append(local_2f8._M_local_buf,(ulong)local_338);
              sVar12 = __return_storage_ptr__->_M_string_length;
              bVar16 = true;
              if (sVar12 == local_360._16_8_) {
                if (sVar12 == 0) {
                  bVar16 = false;
                }
                else {
                  iVar6 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_360._8_8_,
                               sVar12);
                  bVar16 = iVar6 != 0;
                }
              }
              compatibilityAgree_abi_cxx11_((string *)local_240,t,bVar16);
              std::__cxx11::string::_M_append(local_2f8._M_local_buf,(ulong)local_240);
              if (local_240 != (undefined1  [8])local_230) {
                operator_delete((void *)local_240,local_230[0]._M_allocated_capacity + 1);
              }
              if (local_360[0] == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_240,"The INTERFACE_",0xe);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_240,(p->_M_dataplus)._M_p,p->_M_string_length)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," property of \"",0xe);
                psVar10 = cmTarget::GetName_abi_cxx11_(tgt_00->Target);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" does\nnot agree with the value of ",0x23);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11," already determined\nfor \"",0x19);
                psVar10 = cmTarget::GetName_abi_cxx11_(tgt->Target);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\".\n",3);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error((string *)&local_318);
                goto LAB_00373fab;
              }
              iVar6 = 3;
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              goto LAB_00373fee;
            }
            local_240 = (undefined1  [8])local_230;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_240,local_338,local_338 + local_330);
            std::__cxx11::string::append((char *)local_240);
            std::__cxx11::string::_M_append(local_2f8._M_local_buf,(ulong)local_240);
            if (local_240 != (undefined1  [8])local_230) {
              operator_delete((void *)local_240,local_230[0]._M_allocated_capacity + 1);
            }
            std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            bVar15 = true;
            iVar6 = 0;
          }
          else {
            local_70[0] = local_60;
            pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_70,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
            local_238 = (char *)0x0;
            local_230[0]._M_allocated_capacity =
                 local_230[0]._M_allocated_capacity & 0xffffffffffffff00;
            local_240 = (undefined1  [8])local_230;
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_240);
            if (local_240 != (undefined1  [8])local_230) {
              operator_delete((void *)local_240,local_230[0]._M_allocated_capacity + 1);
            }
            if (local_70[0] != local_60) {
              operator_delete(local_70[0],(ulong)((long)&(local_60[0]._M_nxt)->_M_nxt + 1));
            }
            __return_storage_ptr__ = local_298;
            if (_Var8._M_current != pbVar4) {
              consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_360,local_298,&local_2b8,t);
              std::__cxx11::string::_M_append(local_2f8._M_local_buf,(ulong)local_338);
              sVar12 = __return_storage_ptr__->_M_string_length;
              bVar16 = true;
              if (sVar12 == local_360._16_8_) {
                if (sVar12 == 0) {
                  bVar16 = false;
                }
                else {
                  iVar6 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_360._8_8_,
                               sVar12);
                  bVar16 = iVar6 != 0;
                }
              }
              compatibilityAgree_abi_cxx11_((string *)local_240,t,bVar16);
              std::__cxx11::string::_M_append(local_2f8._M_local_buf,(ulong)local_240);
              if (local_240 != (undefined1  [8])local_230) {
                operator_delete((void *)local_240,local_230[0]._M_allocated_capacity + 1);
              }
              if (local_360[0] == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_240,"Property ",9);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_240,(p->_M_dataplus)._M_p,p->_M_string_length)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," on target \"",0xc);
                psVar10 = cmTarget::GetName_abi_cxx11_(tgt->Target);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" is\nimplied to be ",0x13);
                pcVar3 = local_c8;
                if (local_c8 == (char *)0x0) {
                  std::ios::clear((int)poVar11 + (int)poVar11->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar12 = strlen(local_c8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar3,sVar12);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,
                           " because it was used to determine the link libraries\nalready. The INTERFACE_"
                           ,0x4c);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11," property on\ndependency \"",0x19);
                psVar10 = cmTarget::GetName_abi_cxx11_(tgt_00->Target);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" is in conflict.\n",0x12);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error((string *)&local_318);
                goto LAB_00373fab;
              }
              iVar6 = 3;
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              goto LAB_00373fee;
            }
            iVar6 = 3;
          }
        }
        else if (_Var8._M_current == pbVar4) {
LAB_00373a4a:
          iVar6 = 3;
        }
        else {
          consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_360,__return_storage_ptr__,&local_2b8,t);
          std::__cxx11::string::_M_append(local_2f8._M_local_buf,(ulong)local_338);
          sVar12 = __return_storage_ptr__->_M_string_length;
          bVar16 = true;
          if (sVar12 == local_360._16_8_) {
            if (sVar12 == 0) {
              bVar16 = false;
            }
            else {
              iVar6 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_360._8_8_,sVar12
                          );
              bVar16 = iVar6 != 0;
            }
          }
          compatibilityAgree_abi_cxx11_((string *)local_240,t,bVar16);
          std::__cxx11::string::_M_append(local_2f8._M_local_buf,(ulong)local_240);
          if (local_240 != (undefined1  [8])local_230) {
            operator_delete((void *)local_240,local_230[0]._M_allocated_capacity + 1);
          }
          if (local_360[0] == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"Property ",9);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_240,(p->_M_dataplus)._M_p,p->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," on target \"",0xc);
            psVar10 = cmTarget::GetName_abi_cxx11_(tgt->Target);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,"\" does\nnot match the INTERFACE_",0x1f);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(p->_M_dataplus)._M_p,p->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11," property requirement\nof dependency \"",0x25);
            psVar10 = cmTarget::GetName_abi_cxx11_(tgt_00->Target);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\".\n",3);
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error((string *)&local_318);
LAB_00373fab:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_318._M_allocated_capacity != &local_308) {
              operator_delete((void *)local_318._M_allocated_capacity,
                              local_308._M_allocated_capacity + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
            std::ios_base::~ios_base(local_1d0);
            iVar6 = 2;
          }
          else {
            iVar6 = 3;
            std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
          }
LAB_00373fee:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._8_8_ != &local_348) {
            operator_delete((void *)local_360._8_8_,local_348._0_8_ + 1);
          }
        }
        if (local_338 != &local_328) {
          operator_delete(local_338,CONCAT71(uStack_327,local_328) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a0);
      } while (((iVar6 == 3) || (iVar6 == 0)) &&
              (ppcVar13 = local_a8 + 1, pbVar5 = local_298, ppcVar13 != local_b8));
    }
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_280 = &local_270;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_280,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
    if (local_280 == &local_270) {
      local_230[0]._8_8_ = local_270._8_8_;
      local_240 = (undefined1  [8])local_230;
    }
    else {
      local_240 = (undefined1  [8])local_280;
    }
    local_230[0]._M_allocated_capacity._1_7_ = local_270._M_allocated_capacity._1_7_;
    local_230[0]._M_local_buf[0] = local_270._M_local_buf[0];
    local_238 = local_278;
    local_278 = (char *)0x0;
    local_270._M_local_buf[0] = '\0';
    local_280 = &local_270;
    compatibilityType_abi_cxx11_((string *)local_360,t);
    cmGeneratorTarget::ReportPropertyOrigin
              (tgt,p,(string *)local_240,(string *)&local_2f8,(string *)local_360);
    if ((cmLocalGenerator *)local_360._0_8_ != (cmLocalGenerator *)(local_360 + 0x10)) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
    if (local_240 != (undefined1  [8])local_230) {
      operator_delete((void *)local_240,local_230[0]._M_allocated_capacity + 1);
    }
    if (local_280 != &local_270) {
      operator_delete(local_280,
                      CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0]) + 1)
      ;
    }
    if (local_368 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                ((default_delete<cmGeneratorExpressionInterpreter> *)&local_368,
                 (cmGeneratorExpressionInterpreter *)local_368);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,local_2e8._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return __return_storage_ptr__;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet = cm::contains(headPropKeys, p);

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = cmStrCat(" * Target \"", tgt->GetName());
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter;
  if (p == "POSITION_INDEPENDENT_CODE") {
    genexInterpreter = cm::make_unique<cmGeneratorExpressionInterpreter>(
      tgt->GetLocalGenerator(), config, tgt);
  }

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = cm::contains(propKeys, interfaceProperty);
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}